

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-loader.cc
# Opt level: O0

expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::image::GetImageInfoFromMemory
            (expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,uint8_t *addr,size_t sz,string *uri)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  undefined1 local_a8 [43];
  bool ok;
  undefined1 local_78 [8];
  string err;
  ImageInfoResult ret;
  string *uri_local;
  size_t sz_local;
  uint8_t *addr_local;
  
  ret.warning.field_2._8_8_ = uri;
  ImageInfoResult::ImageInfoResult((ImageInfoResult *)((long)&err.field_2 + 8));
  ::std::__cxx11::string::string((string *)local_78);
  iVar1 = IsEXRFromMemory(addr,sz);
  if (iVar1 == 0) {
    register0x00000000 =
         nonstd::expected_lite::make_unexpected<char_const(&)[17]>
                   ((char (*) [17])"TODO: EXR format");
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)(local_a8 + 0x28));
  }
  else {
    local_a8[0x23] =
         anon_unknown_3::GetImageInfoSTB
                   (addr,sz,(string *)ret.warning.field_2._8_8_,
                    (uint32_t *)(err.field_2._M_local_buf + 8),
                    (uint32_t *)(err.field_2._M_local_buf + 0xc),&ret.width,(string *)&ret.channels,
                    (string *)local_78);
    if ((bool)local_a8[0x23]) {
      nonstd::expected_lite::
      expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<tinyusdz::image::ImageInfoResult,_0>
                (__return_storage_ptr__,(ImageInfoResult *)((long)&err.field_2 + 8));
    }
    else {
      nonstd::expected_lite::make_unexpected<std::__cxx11::string&>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_a8,(expected_lite *)local_78,value);
      nonstd::expected_lite::
      expected<tinyusdz::image::ImageInfoResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                  *)local_a8);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_a8);
    }
  }
  local_a8._36_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_78);
  ImageInfoResult::~ImageInfoResult((ImageInfoResult *)((long)&err.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<image::ImageInfoResult, std::string> GetImageInfoFromMemory(
    const uint8_t *addr, size_t sz, const std::string &uri) {
  image::ImageInfoResult ret;
  std::string err;

#if defined(TINYUSDZ_WITH_EXR)
  if (TINYEXR_SUCCESS == IsEXRFromMemory(addr, sz)) {

    return nonstd::make_unexpected("TODO: EXR format");
  }
#endif

#if defined(TINYUSDZ_WITH_TIFF)
  if (tinydng::IsDNGFromMemory(reinterpret_cast<const char *>(addr), uint32_t(sz), &err)) {

      return nonstd::make_unexpected("TODO: TIFF/DNG format");

  }
#endif

#if defined(TINYUSDZ_USE_WUFFS_IMAGE_LOADER)
  bool ok = GetImageInfoWUFF(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#elif !defined(TINYUSDZ_NO_BUILTIN_IMAGE_LOADER)
  bool ok = GetImageInfoSTB(addr, sz, uri, &ret.width, &ret.height, &ret.channels, &ret.warning, &err);
#else
  (void)addr;
  (void)sz;
  (void)uri;
  bool ok = false;
  err = "Image loading feature is disabled in this build. TODO: use user-supplied image info function\n";
#endif
  if (!ok) {
    return nonstd::make_unexpected(err);
  }

  return std::move(ret);
}